

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O1

bool __thiscall
Catch::Generators::Generators<std::tuple<int,_int>_>::next(Generators<std::tuple<int,_int>_> *this)

{
  pointer pGVar1;
  bool bVar2;
  
  pGVar1 = (this->m_generators).
           super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->m_current <
      (ulong)((long)(this->m_generators).
                    super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3)) {
    bVar2 = GeneratorWrapper<std::tuple<int,_int>_>::next(pGVar1 + this->m_current);
    if (!bVar2) {
      this->m_current = this->m_current + 1;
    }
    return this->m_current <
           (ulong)((long)(this->m_generators).
                         super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_generators).
                         super__Vector_base<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>,_std::allocator<Catch::Generators::GeneratorWrapper<std::tuple<int,_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return false;
}

Assistant:

bool next() override {
            if (m_current >= m_generators.size()) {
                return false;
            }
            const bool current_status = m_generators[m_current].next();
            if (!current_status) {
                ++m_current;
            }
            return m_current < m_generators.size();
        }